

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

void quicly_free(quicly_conn_t *conn)

{
  st_quicly_update_open_count_t *psVar1;
  st_quicly_pending_path_challenge_t *__ptr;
  kh_quicly_stream_t_t *__ptr_00;
  ptls_cipher_context_t *ppVar2;
  ptls_aead_context_t *ppVar3;
  st_quicly_application_space_t *psVar4;
  
  lock_now(conn,0);
  psVar1 = ((conn->super).ctx)->update_open_count;
  if (psVar1 != (st_quicly_update_open_count_t *)0x0) {
    (*psVar1->cb)(psVar1,-1);
  }
  destroy_all_streams(conn,0,1);
  clear_datagram_frame_payloads(conn);
  while (__ptr = (conn->egress).path_challenge.head,
        __ptr != (st_quicly_pending_path_challenge_t *)0x0) {
    (conn->egress).path_challenge.head = __ptr->next;
    free(__ptr);
  }
  quicly_sentmap_dispose(&(conn->egress).loss.sentmap);
  __ptr_00 = conn->streams;
  if (__ptr_00 != (kh_quicly_stream_t_t *)0x0) {
    free(__ptr_00->keys);
    free(__ptr_00->flags);
    free(__ptr_00->vals);
    free(__ptr_00);
  }
  if ((anon_struct_48_2_64f3ff10_for_pending_streams *)
      (conn->egress).pending_streams.blocked.uni.prev != &(conn->egress).pending_streams) {
    __assert_fail("!quicly_linklist_is_linked(&conn->egress.pending_streams.blocked.uni)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/../lib/quicly.c"
                  ,0x61d,"void quicly_free(quicly_conn_t *)");
  }
  if ((conn->egress).pending_streams.blocked.bidi.prev !=
      &(conn->egress).pending_streams.blocked.bidi) {
    __assert_fail("!quicly_linklist_is_linked(&conn->egress.pending_streams.blocked.bidi)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/../lib/quicly.c"
                  ,0x61e,"void quicly_free(quicly_conn_t *)");
  }
  if ((conn->egress).pending_streams.control.prev == &(conn->egress).pending_streams.control) {
    if ((st_quicly_default_scheduler_state_t *)(conn->super)._default_scheduler.active.prev !=
        &(conn->super)._default_scheduler) {
      __assert_fail("!quicly_linklist_is_linked(&conn->super._default_scheduler.active)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/../lib/quicly.c"
                    ,0x620,"void quicly_free(quicly_conn_t *)");
    }
    if ((conn->super)._default_scheduler.blocked.prev == &(conn->super)._default_scheduler.blocked)
    {
      free_handshake_space(&conn->initial);
      free_handshake_space(&conn->handshake);
      psVar4 = conn->application;
      if (psVar4 != (st_quicly_application_space_t *)0x0) {
        ppVar2 = (psVar4->cipher).ingress.header_protection.zero_rtt;
        if (ppVar2 != (ptls_cipher_context_t *)0x0) {
          ptls_cipher_free(ppVar2);
          psVar4 = conn->application;
        }
        ppVar2 = (psVar4->cipher).ingress.header_protection.one_rtt;
        if (ppVar2 != (ptls_cipher_context_t *)0x0) {
          ptls_cipher_free(ppVar2);
          psVar4 = conn->application;
        }
        ppVar3 = (psVar4->cipher).ingress.aead[0];
        if (ppVar3 != (ptls_aead_context_t *)0x0) {
          ptls_aead_free(ppVar3);
          psVar4 = conn->application;
        }
        ppVar3 = (psVar4->cipher).ingress.aead[1];
        if (ppVar3 != (ptls_aead_context_t *)0x0) {
          ptls_aead_free(ppVar3);
          psVar4 = conn->application;
        }
        ppVar3 = (psVar4->cipher).egress.key.aead;
        if (ppVar3 != (ptls_aead_context_t *)0x0) {
          ptls_aead_free(ppVar3);
          ptls_cipher_free((psVar4->cipher).egress.key.header_protection);
          psVar4 = conn->application;
        }
        (*ptls_clear_memory)((psVar4->cipher).egress.secret,0x40);
        do_free_pn_space(&conn->application->super);
        conn->application = (st_quicly_application_space_t *)0x0;
      }
      ptls_buffer__release_memory(&(conn->crypto).transport_params.buf);
      (conn->crypto).transport_params.buf.off = 0;
      *(undefined8 *)&(conn->crypto).transport_params.buf.is_allocated = 0;
      (conn->crypto).transport_params.buf.base = (uint8_t *)0x0;
      (conn->crypto).transport_params.buf.capacity = 0;
      ptls_free((conn->crypto).tls);
      unlock_now(conn);
      free((conn->token).base);
      free(conn);
      return;
    }
    __assert_fail("!quicly_linklist_is_linked(&conn->super._default_scheduler.blocked)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/../lib/quicly.c"
                  ,0x621,"void quicly_free(quicly_conn_t *)");
  }
  __assert_fail("!quicly_linklist_is_linked(&conn->egress.pending_streams.control)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/../lib/quicly.c"
                ,0x61f,"void quicly_free(quicly_conn_t *)");
}

Assistant:

void quicly_free(quicly_conn_t *conn)
{
    lock_now(conn, 0);

    QUICLY_PROBE(FREE, conn, conn->stash.now);

#if QUICLY_USE_EMBEDDED_PROBES || QUICLY_USE_DTRACE
    if (QUICLY_CONN_STATS_ENABLED()) {
        quicly_stats_t stats;
        quicly_get_stats(conn, &stats);
        QUICLY_PROBE(CONN_STATS, conn, conn->stash.now, &stats, sizeof(stats));
    }
#endif
    update_open_count(conn->super.ctx, -1);

    destroy_all_streams(conn, 0, 1);
    clear_datagram_frame_payloads(conn);

    quicly_maxsender_dispose(&conn->ingress.max_data.sender);
    quicly_maxsender_dispose(&conn->ingress.max_streams.uni);
    quicly_maxsender_dispose(&conn->ingress.max_streams.bidi);
    while (conn->egress.path_challenge.head != NULL) {
        struct st_quicly_pending_path_challenge_t *pending = conn->egress.path_challenge.head;
        conn->egress.path_challenge.head = pending->next;
        free(pending);
    }
    quicly_loss_dispose(&conn->egress.loss);

    kh_destroy(quicly_stream_t, conn->streams);

    assert(!quicly_linklist_is_linked(&conn->egress.pending_streams.blocked.uni));
    assert(!quicly_linklist_is_linked(&conn->egress.pending_streams.blocked.bidi));
    assert(!quicly_linklist_is_linked(&conn->egress.pending_streams.control));
    assert(!quicly_linklist_is_linked(&conn->super._default_scheduler.active));
    assert(!quicly_linklist_is_linked(&conn->super._default_scheduler.blocked));

    free_handshake_space(&conn->initial);
    free_handshake_space(&conn->handshake);
    free_application_space(&conn->application);

    ptls_buffer_dispose(&conn->crypto.transport_params.buf);
    ptls_free(conn->crypto.tls);

    unlock_now(conn);

    free(conn->token.base);
    free(conn);
}